

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode AllowServerConnect(Curl_easy *data,_Bool *connected)

{
  uint uVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  timediff_t tVar4;
  ulong uVar5;
  
  *connected = false;
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
    Curl_infof(data,"Preparing for accepting server on data port");
  }
  Curl_pgrsTime(data,TIMER_STARTACCEPT);
  tVar4 = ftp_timeleft_accept(data);
  if (tVar4 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    uVar5 = 0xc;
  }
  else {
    CVar3 = ReceivedServerConnect(data,connected);
    if (CVar3 == CURLE_OK) {
      if (*connected != true) {
        uVar1 = (data->set).accepttimeout;
        uVar5 = 60000;
        if (uVar1 != 0) {
          uVar5 = (ulong)uVar1;
        }
        Curl_expire(data,uVar5,EXPIRE_FTP_ACCEPT);
        uVar5 = 0;
        goto LAB_0012d5e3;
      }
      CVar3 = AcceptServerConnect(data);
      if (CVar3 == CURLE_OK) {
        CVar3 = InitiateTransfer(data);
      }
    }
    uVar5 = (ulong)CVar3;
  }
LAB_0012d5e3:
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    Curl_trc_ftp(data,"AllowServerConnect() -> %d",uVar5);
  }
  return (CURLcode)uVar5;
}

Assistant:

static CURLcode AllowServerConnect(struct Curl_easy *data, bool *connected)
{
  timediff_t timeout_ms;
  CURLcode result = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    result = CURLE_FTP_ACCEPT_TIMEOUT;
    goto out;
  }

  /* see if the connection request is already here */
  result = ReceivedServerConnect(data, connected);
  if(result)
    goto out;

  if(*connected) {
    result = AcceptServerConnect(data);
    if(result)
      goto out;

    result = InitiateTransfer(data);
    if(result)
      goto out;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    Curl_expire(data, data->set.accepttimeout ?
                data->set.accepttimeout : DEFAULT_ACCEPT_TIMEOUT,
                EXPIRE_FTP_ACCEPT);
  }

out:
  CURL_TRC_FTP(data, "AllowServerConnect() -> %d", result);
  return result;
}